

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyHttpImpl::QNetworkReplyHttpImpl
          (QNetworkReplyHttpImpl *this,QNetworkAccessManager *manager,QNetworkRequest *request,
          Operation *operation,QIODevice *outgoingData)

{
  QArrayData *pQVar1;
  void **ppvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  QNetworkReplyHttpImplPrivate *pQVar7;
  QSslConfiguration *other;
  undefined4 *puVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  char *pcVar10;
  long in_FS_OFFSET;
  QStringView QVar11;
  QByteArrayView value;
  QByteArrayView QVar12;
  optional<long_long> oVar13;
  QLatin1String QVar14;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar15;
  QObject local_a0 [8];
  QVariant local_98;
  undefined1 local_78 [16];
  QMetaTypeInterface *local_68;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (QNetworkReplyHttpImplPrivate *)operator_new(0x448);
  QNetworkReplyHttpImplPrivate::QNetworkReplyHttpImplPrivate(pQVar7);
  QNetworkReply::QNetworkReply
            ((QNetworkReply *)this,(QNetworkReplyPrivate *)pQVar7,&manager->super_QObject);
  *(undefined ***)this = &PTR_metaObject_002d4390;
  pQVar7 = *(QNetworkReplyHttpImplPrivate **)(this + 8);
  pQVar7->manager = manager;
  pQVar7->managerPrivate = *(QNetworkAccessManagerPrivate **)&manager->field_0x8;
  QNetworkRequest::operator=(&(pQVar7->super_QNetworkReplyPrivate).request,request);
  QNetworkRequest::operator=(&(pQVar7->super_QNetworkReplyPrivate).originalRequest,request);
  (pQVar7->super_QNetworkReplyPrivate).operation = *operation;
  pQVar7->outgoingData = outgoingData;
  QNetworkRequest::url((QNetworkRequest *)&local_58.shared);
  pQVar1 = (QArrayData *)(pQVar7->super_QNetworkReplyPrivate).url.d;
  (pQVar7->super_QNetworkReplyPrivate).url.d = (QUrlPrivate *)local_58.shared;
  local_58.shared = (PrivateShared *)pQVar1;
  QUrl::~QUrl((QUrl *)&local_58.shared);
  QNetworkRequest::url((QNetworkRequest *)local_78);
  QUrl::scheme();
  if (local_58._16_8_ == 5) {
    QVar11.m_data = (storage_type_conflict *)local_58._8_8_;
    QVar11.m_size = 5;
    QVar14.m_data = "https";
    QVar14.m_size = 5;
    cVar5 = QtPrivate::equalStrings(QVar11,QVar14);
  }
  else {
    cVar5 = '\0';
  }
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)local_78);
  if (cVar5 != '\0') {
    other = (QSslConfiguration *)operator_new(8);
    QNetworkRequest::sslConfiguration((QNetworkRequest *)other);
    QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::reset
              (&pQVar7->sslConfiguration,other);
  }
  local_58.shared = (PrivateShared *)QNetworkReply::redirectAllowed;
  local_58._8_8_ = 0;
  local_78._0_8_ = QNetworkReplyHttpImplPrivate::followRedirect;
  local_78._8_8_ = (ImplFn)0x0;
  ppvVar2 = *(void ***)&(pQVar7->super_QNetworkReplyPrivate).field_0x8;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QNetworkReplyHttpImplPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar8 + 4) = QNetworkReplyHttpImplPrivate::followRedirect;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)this,(QObject *)local_58.data,ppvVar2,(QSlotObjectBase *)local_78,
             (ConnectionType)puVar8,(int *)CONCAT44(uVar15,2),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QIODevice::open(this,1);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QMetaTypeInterface *)0x0;
  local_78._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
  local_78._8_8_ = (ImplFn)0x0;
  local_60 = 2;
  QNetworkRequest::attribute
            ((QVariant *)&local_58,request,SynchronousRequestAttribute,(QVariant *)local_78);
  QVariant::~QVariant((QVariant *)local_78);
  if (puStack_40 < (undefined1 *)0x4) {
LAB_002165ed:
    if (outgoingData != (QIODevice *)0x0) {
      cVar5 = (**(code **)(*(long *)pQVar7->outgoingData + 0x60))();
      if (cVar5 == '\0') {
LAB_0021668d:
        pcVar10 = "_q_startOperation";
      }
      else {
        QVariant::QVariant(&local_98,false);
        QNetworkRequest::attribute
                  ((QVariant *)local_78,request,DoNotBufferUploadDataAttribute,&local_98);
        cVar5 = QVariant::toBool();
        QVariant::~QVariant((QVariant *)local_78);
        QVariant::~QVariant(&local_98);
        if (cVar5 != '\0') {
          QNetworkRequest::headers((QNetworkRequest *)local_78);
          QVar12 = QHttpHeaders::value((QHttpHeaders *)local_78,ContentLength,
                                       (QByteArrayView)ZEXT816(0));
          value.m_data = QVar12.m_data;
          value.m_size = (qsizetype)value.m_data;
          oVar13 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar12.m_size,value);
          QHttpHeaders::~QHttpHeaders((QHttpHeaders *)local_78);
          if (((undefined1  [16])
               oVar13.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) goto LAB_0021668d;
        }
        pQVar7->state = Buffering;
        pcVar10 = "_q_bufferOutgoingData";
      }
      local_68 = (QMetaTypeInterface *)0x0;
      local_78._8_8_ = (ImplFn)0x0;
      local_78._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
      QMetaObject::invokeMethodImpl
                ((QObject *)this,pcVar10,QueuedConnection,1,(void **)local_78,
                 (char **)(local_78 + 8),&local_68);
      goto LAB_00216703;
    }
  }
  else {
    bVar6 = (bool)QVariant::toBool();
    pQVar7->synchronous = bVar6;
    if (outgoingData == (QIODevice *)0x0 || bVar6 != true) goto LAB_002165ed;
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    p_Var9->_M_use_count = 1;
    p_Var9->_M_weak_count = 1;
    p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002d0c40;
    p_Var9[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var9[1]._M_use_count = 0;
    p_Var9[1]._M_weak_count = 0;
    p_Var9[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var9[2]._M_use_count = 0;
    p_Var9[2]._M_weak_count = 0;
    *(undefined4 *)&p_Var9[3]._vptr__Sp_counted_base = 0x1000;
    (pQVar7->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)(p_Var9 + 1);
    this_00 = (pQVar7->outgoingDataBuffer).
              super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (pQVar7->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var9;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    do {
      peVar3 = (pQVar7->outgoingDataBuffer).
               super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar4 = peVar3->bufferSize;
      QIODevice::readAll();
      QRingBuffer::append((QByteArray *)peVar3);
      if ((totally_ordered_wrapper<QNetworkRequestPrivate_*>)local_78._0_8_ !=
          (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0) {
        LOCK();
        *(int *)local_78._0_8_ = *(int *)local_78._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_78._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,1,0x10);
        }
      }
    } while (((pQVar7->outgoingDataBuffer).
              super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->bufferSize !=
             lVar4);
  }
  QNetworkReplyHttpImplPrivate::_q_startOperation(pQVar7);
LAB_00216703:
  QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkReplyHttpImpl::QNetworkReplyHttpImpl(QNetworkAccessManager* const manager,
                                             const QNetworkRequest& request,
                                             QNetworkAccessManager::Operation& operation,
                                             QIODevice* outgoingData)
    : QNetworkReply(*new QNetworkReplyHttpImplPrivate, manager)
{
    Q_D(QNetworkReplyHttpImpl);
    Q_ASSERT(manager);
    d->manager = manager;
    d->managerPrivate = manager->d_func();
    d->request = request;
    d->originalRequest = request;
    d->operation = operation;
    d->outgoingData = outgoingData;
    d->url = request.url();
#ifndef QT_NO_SSL
    if (request.url().scheme() == "https"_L1)
        d->sslConfiguration.reset(new QSslConfiguration(request.sslConfiguration()));
#endif

    QObjectPrivate::connect(this, &QNetworkReplyHttpImpl::redirectAllowed, d,
            &QNetworkReplyHttpImplPrivate::followRedirect, Qt::QueuedConnection);

    // FIXME Later maybe set to Unbuffered, especially if it is zerocopy or from cache?
    QIODevice::open(QIODevice::ReadOnly);


    // Internal code that does a HTTP reply for the synchronous Ajax
    // in Qt WebKit.
    QVariant synchronousHttpAttribute = request.attribute(
            static_cast<QNetworkRequest::Attribute>(QNetworkRequest::SynchronousRequestAttribute));
    if (synchronousHttpAttribute.isValid()) {
        d->synchronous = synchronousHttpAttribute.toBool();
        if (d->synchronous && outgoingData) {
            // The synchronous HTTP is a corner case, we will put all upload data in one big QByteArray in the outgoingDataBuffer.
            // Yes, this is not the most efficient thing to do, but on the other hand synchronous XHR needs to die anyway.
            d->outgoingDataBuffer = std::make_shared<QRingBuffer>();
            qint64 previousDataSize = 0;
            do {
                previousDataSize = d->outgoingDataBuffer->size();
                d->outgoingDataBuffer->append(d->outgoingData->readAll());
            } while (d->outgoingDataBuffer->size() != previousDataSize);
            d->_q_startOperation();
            return;
        }
    }


    if (outgoingData) {
        // there is data to be uploaded, e.g. HTTP POST.

        if (!d->outgoingData->isSequential()) {
            // fixed size non-sequential (random-access)
            // just start the operation
            QMetaObject::invokeMethod(this, "_q_startOperation", Qt::QueuedConnection);
            // FIXME make direct call?
        } else {
            bool bufferingDisallowed =
                    request.attribute(QNetworkRequest::DoNotBufferUploadDataAttribute,
                                  false).toBool();

            if (bufferingDisallowed) {
                // if a valid content-length header for the request was supplied, we can disable buffering
                // if not, we will buffer anyway

                const auto sizeOpt = QNetworkHeadersPrivate::toInt(
                        request.headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
                 if (sizeOpt) {
                    QMetaObject::invokeMethod(this, "_q_startOperation", Qt::QueuedConnection);
                    // FIXME make direct call?
                } else {
                    d->state = d->Buffering;
                    QMetaObject::invokeMethod(this, "_q_bufferOutgoingData", Qt::QueuedConnection);
                }
            } else {
                // _q_startOperation will be called when the buffering has finished.
                d->state = d->Buffering;
                QMetaObject::invokeMethod(this, "_q_bufferOutgoingData", Qt::QueuedConnection);
            }
        }
    } else {
        // No outgoing data (POST, ..)
        d->_q_startOperation();
    }
}